

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BytecodeSets.cpp
# Opt level: O1

void Lodtalk::dumpSistaBytecode(uint8_t *buffer,size_t size)

{
  byte *pbVar1;
  byte bVar2;
  long lVar3;
  string *psVar4;
  ulong uVar5;
  
  if (size != 0) {
    uVar5 = 0;
    do {
      bVar2 = buffer[uVar5];
      psVar4 = getSistaBytecodeName_abi_cxx11_((uint)bVar2);
      printf("%s",(psVar4->_M_dataplus)._M_p);
      if (bVar2 < 0xe0) {
        uVar5 = uVar5 + 1;
      }
      else {
        lVar3 = uVar5 + 1;
        uVar5 = uVar5 + 2;
        printf(" %d",(ulong)buffer[lVar3]);
      }
      if (0xf7 < bVar2) {
        pbVar1 = buffer + uVar5;
        uVar5 = uVar5 + 1;
        printf(" %d",(ulong)*pbVar1);
      }
      putchar(10);
    } while (uVar5 < size);
  }
  return;
}

Assistant:

void dumpSistaBytecode(uint8_t *buffer, size_t size)
{
    size_t pos = 0;
    while(pos < size)
    {
        auto opcode = buffer[pos++];
        auto instructionSize = getSistaBytecodeSize(opcode);
        printf("%s", getSistaBytecodeName(opcode).c_str());
        if(instructionSize > 1)
            printf(" %d", buffer[pos++]);
        if(instructionSize > 2)
            printf(" %d", buffer[pos++]);
        printf("\n");
    }
}